

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool __thiscall
ON_Extrusion::GetSpanVectorIndex
          (ON_Extrusion *this,int dir,double t,int side,int *span_vector_index,
          ON_Interval *span_interval)

{
  int iVar1;
  int path_dir;
  ON_Interval *span_interval_local;
  int *span_vector_index_local;
  int side_local;
  double t_local;
  int dir_local;
  ON_Extrusion *this_local;
  
  iVar1 = PathParameter(this);
  if (iVar1 == dir) {
    if (span_vector_index != (int *)0x0) {
      *span_vector_index = 0;
    }
    if (span_interval != (ON_Interval *)0x0) {
      span_interval->m_t[0] = (this->m_path_domain).m_t[0];
      span_interval->m_t[1] = (this->m_path_domain).m_t[1];
    }
    this_local._7_1_ = true;
  }
  else if ((1 - iVar1 == dir) && (this->m_profile != (ON_Curve *)0x0)) {
    iVar1 = (*(this->m_profile->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2b])
                      (t,this->m_profile,(ulong)(uint)side,span_vector_index,span_interval);
    this_local._7_1_ = (bool)((byte)iVar1 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Extrusion::GetSpanVectorIndex(
      int dir , // 0 gets first parameter's domain, 1 gets second parameter's domain
      double t,      // [IN] t = evaluation parameter
      int side,         // [IN] side 0 = default, -1 = from below, +1 = from above
      int* span_vector_index,        // [OUT] span vector index
      ON_Interval* span_interval // [OUT] domain of the span containing "t"
      ) const
{
  const int path_dir = PathParameter();
  if ( path_dir == dir )
  {
    if ( span_vector_index )
      *span_vector_index = 0;
    if ( span_interval )
      *span_interval = m_path_domain;
    return true;
  }
  if ( 1-path_dir == dir && m_profile )
  {
    return m_profile->GetSpanVectorIndex(t,side,span_vector_index,span_interval);
  }
  return false;
}